

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx512::PointsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,range<unsigned_long> *r,
          size_t k,uint geomID)

{
  undefined1 auVar1 [16];
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  size_t sVar11;
  size_t sVar12;
  uint index;
  ulong uVar13;
  long lVar14;
  long lVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  
  aVar16.m128[2] = INFINITY;
  aVar16._0_8_ = 0x7f8000007f800000;
  aVar16.m128[3] = INFINITY;
  auVar17 = ZEXT1664((undefined1  [16])aVar16);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar16;
  aVar18.m128[2] = -INFINITY;
  aVar18._0_8_ = 0xff800000ff800000;
  aVar18.m128[3] = -INFINITY;
  auVar19 = ZEXT1664((undefined1  [16])aVar18);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar16;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar18;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar13 = r->_begin;
  sVar11 = __return_storage_ptr__->end;
  aVar22 = aVar16;
  aVar20 = aVar18;
  if (uVar13 < r->_end) {
    auVar24._8_4_ = 0xddccb9a2;
    auVar24._0_8_ = 0xddccb9a2ddccb9a2;
    auVar24._12_4_ = 0xddccb9a2;
    auVar25._8_4_ = 0x5dccb9a2;
    auVar25._0_8_ = 0x5dccb9a25dccb9a2;
    auVar25._12_4_ = 0x5dccb9a2;
    auVar23 = ZEXT1664((undefined1  [16])aVar16);
    auVar21 = ZEXT1664((undefined1  [16])aVar18);
    do {
      pBVar2 = (this->super_Points).vertices.items;
      if ((uVar13 & 0xffffffff) < (pBVar2->super_RawBufferView).num) {
        lVar15 = 0;
        bVar10 = false;
        do {
          bVar9 = bVar10;
          if (bVar9) break;
          pcVar3 = pBVar2[lVar15].super_RawBufferView.ptr_ofs;
          lVar14 = pBVar2[lVar15].super_RawBufferView.stride * (uVar13 & 0xffffffff);
          auVar1 = *(undefined1 (*) [16])(pcVar3 + lVar14);
          uVar7 = vcmpps_avx512vl(auVar1,auVar24,6);
          uVar8 = vcmpps_avx512vl(auVar1,auVar25,1);
          if ((byte)((byte)uVar7 & (byte)uVar8) != 0xf) break;
          lVar15 = 1;
          bVar10 = true;
        } while (0.0 <= *(float *)(pcVar3 + lVar14 + 0xc));
      }
      else {
        bVar9 = false;
      }
      sVar12 = k;
      if (bVar9) {
        lVar15 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
        lVar14 = *(long *)&(this->super_Points).field_0x68 * uVar13;
        auVar1 = *(undefined1 (*) [16])(lVar15 + lVar14);
        fVar6 = *(float *)(lVar15 + 0xc + lVar14) * (this->super_Points).maxRadiusScale;
        auVar27._4_4_ = fVar6;
        auVar27._0_4_ = fVar6;
        auVar27._8_4_ = fVar6;
        auVar27._12_4_ = fVar6;
        auVar27 = vsubps_avx(auVar1,auVar27);
        auVar26._0_4_ = auVar1._0_4_ + fVar6;
        auVar26._4_4_ = auVar1._4_4_ + fVar6;
        auVar26._8_4_ = auVar1._8_4_ + fVar6;
        auVar26._12_4_ = auVar1._12_4_ + fVar6;
        aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar27,ZEXT416(geomID),0x30);
        aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar26,ZEXT416((uint)uVar13),0x30);
        auVar1 = vminps_avx(auVar17._0_16_,(undefined1  [16])aVar4);
        auVar17 = ZEXT1664(auVar1);
        auVar1 = vmaxps_avx(auVar19._0_16_,(undefined1  [16])aVar5);
        auVar19 = ZEXT1664(auVar1);
        auVar28._0_4_ = aVar5.x + aVar4.x;
        auVar28._4_4_ = aVar5.y + aVar4.y;
        auVar28._8_4_ = aVar5.z + aVar4.z;
        auVar28._12_4_ = aVar5.field_3.w + aVar4.field_3.w;
        auVar1 = vminps_avx(auVar23._0_16_,auVar28);
        auVar23 = ZEXT1664(auVar1);
        auVar1 = vmaxps_avx(auVar21._0_16_,auVar28);
        auVar21 = ZEXT1664(auVar1);
        sVar11 = sVar11 + 1;
        sVar12 = k + 1;
        prims[k].lower.field_0.field_1 = aVar4;
        prims[k].upper.field_0.field_1 = aVar5;
      }
      aVar20 = auVar21._0_16_;
      aVar22 = auVar23._0_16_;
      aVar18 = auVar19._0_16_;
      aVar16 = auVar17._0_16_;
      uVar13 = uVar13 + 1;
      k = sVar12;
    } while (uVar13 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar16;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar22;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar20;
  __return_storage_ptr__->end = sVar11;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, &bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }